

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d59_q0_vector_swap.cpp
# Opt level: O0

int main(void)

{
  pointer *this;
  bool bVar1;
  istream *piVar2;
  ostream *poVar3;
  size_type sVar4;
  reference piVar5;
  int *x_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  int *x;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int local_68;
  int e2;
  int s2;
  int e1;
  int s1;
  int i_1;
  int i;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  int local_10;
  int c;
  int n;
  
  c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_48);
  std::istream::operator>>((istream *)&std::cin,&local_10);
  for (s1 = 0; s1 < local_10; s1 = s1 + 1) {
    std::istream::operator>>
              ((istream *)&std::cin,
               (int *)((long)&v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4));
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               &v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,
               (value_type *)
               ((long)&v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
  }
  std::istream::operator>>((istream *)&std::cin,&local_10);
  for (e1 = 0; e1 < local_10; e1 = e1 + 1) {
    std::istream::operator>>
              ((istream *)&std::cin,
               (int *)((long)&v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4));
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_48,
               (value_type *)
               ((long)&v1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
  }
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,&s2);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&e2);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&local_68);
  std::istream::operator>>(piVar2,(int *)((long)&__range1 + 4));
  vector_swap((vector<int,_std::allocator<int>_> *)
              &v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_48,s2,e2,local_68,
              __range1._4_4_);
  poVar3 = std::operator<<((ostream *)&std::cout,"v1 has ");
  sVar4 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)
                     &v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  this = &v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  __end1 = std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)this);
  x = (int *)std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &x);
    if (!bVar1) break;
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar5);
    std::operator<<(poVar3," ");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"v2 has ");
  sVar4 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_48);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __end1_1 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_48);
  x_1 = (int *)std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&x_1);
    if (!bVar1) break;
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1_1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar5);
    std::operator<<(poVar3," ");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_1);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &v2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return c;
}

Assistant:

int main() {
    // read input
    int n, c;
    vector<int> v1, v2;
    cin >> n; // number of v1
    for (int i = 0; i < n; i++) {
        cin >> c;
        v1.push_back(c);
    }
    cin >> n; // number of v2
    for (int i = 0; i < n; i++) {
        cin >> c;
        v2.push_back(c);
    }
    int s1, e1, s2, e2; // position
    cin >> s1 >> e1 >> s2 >> e2;
    // call the function
    vector_swap(v1, v2, s1, e1, s2, e2);
    // display content of the stack
    cout << "v1 has " << v1.size() << endl;
    for (auto &x : v1) {
        cout << x << " ";
    }
    cout << endl;
    // display content of the stack
    cout << "v2 has " << v2.size() << endl;
    for (auto &x : v2) {
        cout << x << " ";
    }
    cout << endl;
}